

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BamStandardIndex::Seek(BamStandardIndex *this,int64_t *position,int origin)

{
  IBamIODevice *pIVar1;
  int iVar2;
  BamException *this_00;
  undefined4 in_register_00000014;
  string local_68;
  string local_48;
  
  pIVar1 = (this->m_resources).Device;
  iVar2 = (*pIVar1->_vptr_IBamIODevice[6])(pIVar1,position,CONCAT44(in_register_00000014,origin));
  if ((char)iVar2 != '\0') {
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"BamStandardIndex::Seek","");
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"could not seek in BAI file","");
  BamException::BamException(this_00,&local_68,&local_48);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::Seek(const int64_t& position, const int origin)
{
    if (!m_resources.Device->Seek(position, origin))
        throw BamException("BamStandardIndex::Seek", "could not seek in BAI file");
}